

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall CRPCConvertTable::CRPCConvertTable(CRPCConvertTable *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long lVar3;
  CRPCConvertParam *cp;
  CRPCConvertParam *__args;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(this->members)._M_t._M_impl.super__Rb_tree_header;
  (this->members)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->members)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->members)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->members)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->members)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->membersByName)._M_t._M_impl.super__Rb_tree_header;
  (this->membersByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->membersByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->membersByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->membersByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->membersByName)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __args = vRPCConvertParams;
  lVar3 = 0x5070;
  do {
    std::
    _Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::__cxx11::string,int>,std::_Identity<std::pair<std::__cxx11::string,int>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::__cxx11::string,int>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,int_const&>
              ((_Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::__cxx11::string,int>,std::_Identity<std::pair<std::__cxx11::string,int>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::__cxx11::string,int>>>
                *)this,&__args->methodName,&__args->paramIdx);
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->membersByName,&__args->methodName,&__args->paramName);
    __args = __args + 1;
    lVar3 = lVar3 + -0x48;
  } while (lVar3 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CRPCConvertTable::CRPCConvertTable()
{
    for (const auto& cp : vRPCConvertParams) {
        members.emplace(cp.methodName, cp.paramIdx);
        membersByName.emplace(cp.methodName, cp.paramName);
    }
}